

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strtok_r_63(UChar *src,UChar *delim,UChar **saveState)

{
  uint uVar1;
  UChar *string;
  UChar *pUVar2;
  uint32_t nonDelimIdx;
  UChar *nextToken;
  UChar *tokSource;
  UChar **saveState_local;
  UChar *delim_local;
  UChar *src_local;
  
  if (src == (UChar *)0x0) {
    if (*saveState == (UChar *)0x0) {
      return (UChar *)0x0;
    }
    nextToken = *saveState;
  }
  else {
    *saveState = src;
    nextToken = src;
  }
  uVar1 = u_strspn_63(nextToken,delim);
  string = nextToken + uVar1;
  if (*string == L'\0') {
    *saveState = (UChar *)0x0;
  }
  else {
    pUVar2 = u_strpbrk_63(string,delim);
    if (pUVar2 != (UChar *)0x0) {
      *pUVar2 = L'\0';
      *saveState = pUVar2 + 1;
      return string;
    }
    if (*saveState != (UChar *)0x0) {
      *saveState = (UChar *)0x0;
      return string;
    }
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strtok_r(UChar    *src, 
     const UChar    *delim,
           UChar   **saveState)
{
    UChar *tokSource;
    UChar *nextToken;
    uint32_t nonDelimIdx;

    /* If saveState is NULL, the user messed up. */
    if (src != NULL) {
        tokSource = src;
        *saveState = src; /* Set to "src" in case there are no delimiters */
    }
    else if (*saveState) {
        tokSource = *saveState;
    }
    else {
        /* src == NULL && *saveState == NULL */
        /* This shouldn't happen. We already finished tokenizing. */
        return NULL;
    }

    /* Skip initial delimiters */
    nonDelimIdx = u_strspn(tokSource, delim);
    tokSource = &tokSource[nonDelimIdx];

    if (*tokSource) {
        nextToken = u_strpbrk(tokSource, delim);
        if (nextToken != NULL) {
            /* Create a token */
            *(nextToken++) = 0;
            *saveState = nextToken;
            return tokSource;
        }
        else if (*saveState) {
            /* Return the last token */
            *saveState = NULL;
            return tokSource;
        }
    }
    else {
        /* No tokens were found. Only delimiters were left. */
        *saveState = NULL;
    }
    return NULL;
}